

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool background_threads_disable_single(tsd_t *tsd,background_thread_info_t *info)

{
  int iVar1;
  _Bool _Var2;
  void *ret;
  void *local_20;
  
  pre_reentrancy(tsd,(arena_t *)info);
  malloc_mutex_lock((tsdn_t *)tsd,&info->mtx);
  if (info->state == background_thread_started) {
    info->state = background_thread_stopped;
    pthread_cond_signal((pthread_cond_t *)&info->cond);
    (info->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x48));
    iVar1 = pthread_join(info->thread,&local_20);
    _Var2 = iVar1 != 0;
    if (!_Var2) {
      duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
    }
    post_reentrancy(tsd);
  }
  else {
    (info->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x48));
    post_reentrancy(tsd);
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool
background_threads_disable_single(tsd_t *tsd, background_thread_info_t *info) {
	if (info == &background_thread_info[0]) {
		malloc_mutex_assert_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	} else {
		malloc_mutex_assert_not_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	}

	pre_reentrancy(tsd, NULL);
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	bool has_thread;
	assert(info->state != background_thread_paused);
	if (info->state == background_thread_started) {
		has_thread = true;
		info->state = background_thread_stopped;
		pthread_cond_signal(&info->cond);
	} else {
		has_thread = false;
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

	if (!has_thread) {
		post_reentrancy(tsd);
		return false;
	}
	void *ret;
	if (pthread_join(info->thread, &ret)) {
		post_reentrancy(tsd);
		return true;
	}
	assert(ret == NULL);
	n_background_threads--;
	post_reentrancy(tsd);

	return false;
}